

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O1

string * __thiscall
t_haxe_generator::get_cap_name(string *__return_storage_ptr__,t_haxe_generator *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string *psVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  size_type *psVar9;
  long *plVar10;
  int iVar11;
  char cVar12;
  ulong uVar13;
  bool bVar14;
  string inner;
  string new_inner;
  string inner_types;
  string outer_type;
  string local_138;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  string *local_d8;
  undefined1 *local_d0;
  ulong local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  if (name->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    paVar1 = &name->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&name->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = 0;
    (name->_M_dataplus)._M_p = (pointer)paVar1;
  }
  else {
    cVar12 = (char)name;
    lVar5 = std::__cxx11::string::find(cVar12,0x3c);
    lVar6 = std::__cxx11::string::rfind(cVar12,0x3e);
    if (lVar6 != -1 && lVar5 != -1) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)name);
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)name);
      local_f8 = local_e8;
      local_d8 = __return_storage_ptr__;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8);
      if (local_c8 != 0) {
        uVar8 = 0;
        do {
          uVar13 = uVar8;
          if (uVar8 < local_c8) {
            uVar13 = local_c8;
          }
          iVar11 = 0;
          do {
            if (local_c8 <= uVar8) goto LAB_0021fefb;
            cVar12 = local_d0[uVar8];
            if (cVar12 == ',') {
              bVar14 = iVar11 == 0;
            }
            else {
              if (cVar12 == '<') {
                iVar11 = iVar11 + 1;
              }
              else if (cVar12 == '>') {
                iVar11 = iVar11 + -1;
              }
              bVar14 = false;
            }
            uVar8 = uVar8 + 1;
          } while (!bVar14);
          uVar13 = ((byte)(bVar14 + 1) + uVar8) - 1;
LAB_0021fefb:
          if (local_f0 != 0) {
            std::__cxx11::string::append((char *)&local_f8);
          }
          std::__cxx11::string::substr((ulong)&local_118,(ulong)&local_d0);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_118,local_110 + (long)local_118);
          get_cap_name(&local_138,this,&local_90);
          std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118);
          }
          uVar8 = uVar13 + 1;
        } while (uVar8 < local_c8);
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_70,local_70 + local_68);
      get_cap_name(&local_50,this,&local_b0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar4 = local_d8;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_138.field_2._M_allocated_capacity = *psVar9;
        local_138.field_2._8_8_ = plVar7[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar9;
        local_138._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_138._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_f8);
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_108 = *plVar10;
        lStack_100 = plVar7[3];
        local_118 = &local_108;
      }
      else {
        local_108 = *plVar10;
        local_118 = (long *)*plVar7;
      }
      local_110 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
      (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        lVar5 = plVar7[3];
        (psVar4->field_2)._M_allocated_capacity = *psVar9;
        *(long *)((long)&psVar4->field_2 + 8) = lVar5;
      }
      else {
        (psVar4->_M_dataplus)._M_p = (pointer)*plVar7;
        (psVar4->field_2)._M_allocated_capacity = *psVar9;
      }
      psVar4->_M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_118 != &local_108) {
        operator_delete(local_118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_f8 != local_e8) {
        operator_delete(local_f8);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
      if (local_70 == local_60) {
        return psVar4;
      }
      operator_delete(local_70);
      return psVar4;
    }
    uVar8 = std::__cxx11::string::find_first_not_of((char *)name,0x38daed,0);
    if (uVar8 < name->_M_string_length) {
      pcVar2 = (name->_M_dataplus)._M_p;
      iVar11 = tolower((int)pcVar2[uVar8]);
      pcVar2[uVar8] = (char)iVar11;
      lVar5 = std::__cxx11::string::find(cVar12,0x2e);
      while (lVar5 != -1) {
        uVar8 = lVar5 + 1;
        if (uVar8 < name->_M_string_length) {
          pcVar2 = (name->_M_dataplus)._M_p;
          iVar11 = tolower((int)pcVar2[uVar8]);
          pcVar2[uVar8] = (char)iVar11;
        }
        lVar5 = std::__cxx11::string::find(cVar12,0x2e);
      }
    }
    lVar5 = std::__cxx11::string::rfind(cVar12,0x2e);
    if (lVar5 == -1) {
      uVar8 = std::__cxx11::string::find_first_not_of((char *)name,0x38daed,0);
    }
    else {
      uVar8 = lVar5 + 1;
    }
    if (uVar8 < name->_M_string_length) {
      pcVar2 = (name->_M_dataplus)._M_p;
      iVar11 = toupper((int)pcVar2[uVar8]);
      pcVar2[uVar8] = (char)iVar11;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    paVar1 = &name->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&name->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = name->_M_string_length;
    (name->_M_dataplus)._M_p = (pointer)paVar1;
  }
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string t_haxe_generator::get_cap_name(std::string name) {
  if (name.length() == 0) {
    return name;
  }

  // test.for.Generic< data.Type, or.the.Like> and handle it recursively
  size_t generic_first = name.find('<');
  size_t generic_last = name.rfind('>');
  if ((generic_first != std::string::npos) && (generic_last != std::string::npos)) {
    string outer_type = name.substr(0, generic_first);
    string inner_types = name.substr(generic_first + 1, generic_last - generic_first - 1);

    string new_inner = "";
    size_t comma_start = 0;
    while (comma_start < inner_types.length()) {
      size_t comma_pos = comma_start;
      int nested = 0;

      while (comma_pos < inner_types.length()) {
        bool found = false;
        switch (inner_types[comma_pos]) {
        case '<':
          ++nested;
          break;
        case '>':
          --nested;
          break;
        case ',':
          found = (nested == 0);
          break;
        }
        if (found) {
          break;
        }
        ++comma_pos;
      }

      if (new_inner.length() > 0) {
        new_inner += ",";
      }

      string inner = inner_types.substr(comma_start, comma_pos - comma_start);
      new_inner += get_cap_name(inner);
      comma_start = ++comma_pos;
    }

    return get_cap_name(outer_type) + "<" + new_inner + ">";
  }

  // package name
  size_t index = name.find_first_not_of(" \n\r\t");
  if (index < name.length()) {
    name[index] = tolower(name[index]);
    index = name.find('.');
    while (index != std::string::npos) {
      if (++index < name.length()) {
        name[index] = tolower(name[index]);
      }
      index = name.find('.', index);
    }
  }

  // class name
  index = name.rfind('.');
  if (index != std::string::npos) {
    ++index;
  } else {
    index = name.find_first_not_of(" \n\r\t");
  }

  if (index < name.length()) {
    name[index] = toupper(name[index]);
  }

  return name;
}